

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  float fVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ImVec2 IVar7;
  bool bVar8;
  ImGuiID IVar9;
  ImGuiItemFlags IVar10;
  ImGuiContext *pIVar11;
  ImGuiItemStatusFlags IVar12;
  bool bVar13;
  bool bVar14;
  ImU32 col;
  byte bVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float clip_max_x;
  float fVar19;
  float local_d8;
  float fStack_d4;
  ImVec2 local_c8;
  ImVec2 local_c0;
  undefined1 local_b8 [16];
  ImVec2 button_pos;
  ImVec2 label_size;
  ImVec2 frame_padding_local;
  ImGuiLastItemData last_item_backup;
  
  pIVar11 = GImGui;
  local_b8._0_4_ = tab_id;
  frame_padding_local = frame_padding;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar18 = (bb->Min).x;
  fVar19 = (bb->Max).x;
  if (fVar19 - fVar18 <= 1.0) {
    return;
  }
  button_pos.y = (bb->Min).y;
  local_c0.y = (bb->Max).y;
  local_d8 = frame_padding.x;
  fStack_d4 = frame_padding.y;
  clip_max_x = fVar19 - local_d8;
  local_c8.x = fVar18 + local_d8;
  local_c8.y = button_pos.y + fStack_d4;
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = clip_max_x < local_c8.x + label_size.x;
    fVar18 = (bb->Min).x;
    button_pos.y = (bb->Min).y;
    fVar19 = (bb->Max).x;
  }
  fVar1 = pIVar11->FontSize;
  fVar17 = (fVar19 - (local_d8 + local_d8)) - fVar1;
  uVar16 = -(uint)(fVar17 <= fVar18);
  button_pos.x = (float)(uVar16 & (uint)fVar18 | ~uVar16 & (uint)fVar17);
  if (((close_button_id == 0) ||
      ((!is_contents_visible &&
       (fVar17 = (pIVar11->Style).TabMinWidthForCloseButton, uVar16 = -(uint)(fVar17 <= fVar1),
       fVar19 - fVar18 < (float)(~uVar16 & (uint)fVar17 | uVar16 & (uint)fVar1))))) ||
     ((pIVar11->HoveredId != close_button_id && pIVar11->HoveredId != local_b8._0_4_ &&
      (pIVar11->ActiveId != local_b8._0_4_ && pIVar11->ActiveId != close_button_id)))) {
    bVar8 = false;
  }
  else {
    bVar8 = true;
  }
  bVar15 = fVar1 + button_pos.x <= fVar19 & (byte)flags;
  local_c0.x = clip_max_x;
  if (bVar8) {
    local_b8 = ZEXT416((uint)fVar1);
    IVar9 = (pIVar11->LastItemData).ID;
    IVar10 = (pIVar11->LastItemData).InFlags;
    IVar12 = (pIVar11->LastItemData).StatusFlags;
    fVar18 = (pIVar11->LastItemData).Rect.Min.x;
    uVar3 = *(undefined8 *)&(pIVar11->LastItemData).Rect.Min.y;
    uVar4 = *(undefined8 *)&(pIVar11->LastItemData).Rect.Max.y;
    uVar5 = *(undefined8 *)&(pIVar11->LastItemData).NavRect.Min.y;
    uVar6 = *(undefined8 *)&(pIVar11->LastItemData).NavRect.Max.y;
    IVar2 = (pIVar11->LastItemData).DisplayRect.Max;
    last_item_backup.DisplayRect.Min.y = (pIVar11->LastItemData).DisplayRect.Min.y;
    last_item_backup.DisplayRect.Min.x = (float)((ulong)uVar6 >> 0x20);
    PushStyleVar(0xb,&frame_padding_local);
    bVar13 = CloseButton(close_button_id,&button_pos);
    PopStyleVar(1);
    IVar7.y = last_item_backup.DisplayRect.Min.y;
    IVar7.x = last_item_backup.DisplayRect.Min.x;
    (pIVar11->LastItemData).DisplayRect.Min = IVar7;
    (pIVar11->LastItemData).DisplayRect.Max = IVar2;
    *(undefined8 *)&(pIVar11->LastItemData).NavRect.Min.y = uVar5;
    *(undefined8 *)&(pIVar11->LastItemData).NavRect.Max.y = uVar6;
    *(undefined8 *)&(pIVar11->LastItemData).Rect.Min.y = uVar3;
    *(undefined8 *)&(pIVar11->LastItemData).Rect.Max.y = uVar4;
    (pIVar11->LastItemData).ID = IVar9;
    (pIVar11->LastItemData).InFlags = IVar10;
    (pIVar11->LastItemData).StatusFlags = IVar12;
    (pIVar11->LastItemData).Rect.Min.x = fVar18;
    if (((flags & 4U) == 0) && (bVar14 = IsMouseClicked(2,false), bVar14)) {
      bVar13 = true;
    }
  }
  else {
    if (bVar15 == 0) {
      fVar18 = (bb->Max).x + -1.0;
      bVar13 = false;
      goto LAB_001fb205;
    }
    IVar2 = (pIVar11->Style).FramePadding;
    fVar18 = IVar2.x;
    fVar19 = IVar2.y;
    fVar18 = button_pos.x + fVar1 + button_pos.x + fVar18 + fVar18;
    fVar19 = button_pos.y + fVar1 + button_pos.y + fVar19 + fVar19;
    bVar13 = false;
    local_b8 = ZEXT416((uint)fVar1);
    col = GetColorU32(0,1.0);
    IVar2.y = fVar19 * 0.5;
    IVar2.x = fVar18 * 0.5;
    RenderBullet(draw_list,IVar2,col);
  }
  local_c0.x = (float)local_b8._0_4_ * 0.8;
  fVar18 = (float)local_b8._0_4_;
  if (!bVar8) {
    fVar18 = local_c0.x;
  }
  if (bVar15 == 0) {
    local_c0.x = 0.0;
  }
  fVar18 = clip_max_x - fVar18;
  local_c0.x = clip_max_x - local_c0.x;
  clip_max_x = fVar18;
LAB_001fb205:
  RenderTextEllipsis(draw_list,&local_c8,&local_c0,clip_max_x,fVar18,label,(char *)0x0,&label_size);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = bVar13;
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    const float button_sz = g.FontSize;
    const ImVec2 button_pos(ImMax(bb.Min.x, bb.Max.x - frame_padding.x * 2.0f - button_sz), bb.Min.y);

    // Close Button & Unsaved Marker
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= ImMax(button_sz, g.Style.TabMinWidthForCloseButton))
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    bool unsaved_marker_visible = (flags & ImGuiTabItemFlags_UnsavedDocument) != 0 && (button_pos.x + button_sz <= bb.Max.x);

    if (close_button_visible)
    {
        ImGuiLastItemData last_item_backup = g.LastItemData;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, button_pos))
            close_button_pressed = true;
        PopStyleVar();
        g.LastItemData = last_item_backup;

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;
    }
    else if (unsaved_marker_visible)
    {
        const ImRect bullet_bb(button_pos, button_pos + ImVec2(button_sz, button_sz) + g.Style.FramePadding * 2.0f);
        RenderBullet(draw_list, bullet_bb.GetCenter(), GetColorU32(ImGuiCol_Text));
    }

    // This is all rather complicated
    // (the main idea is that because the close button only appears on hover, we don't want it to alter the ellipsis position)
    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    if (close_button_visible || unsaved_marker_visible)
    {
        text_pixel_clip_bb.Max.x -= close_button_visible ? (button_sz) : (button_sz * 0.80f);
        text_ellipsis_clip_bb.Max.x -= unsaved_marker_visible ? (button_sz * 0.80f) : 0.0f;
        ellipsis_max_x = text_pixel_clip_bb.Max.x;
    }
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}